

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integerCoding.cpp
# Opt level: O0

void tinyusdz::(anonymous_namespace)::_EncodeNHelper<3,unsigned_long_const*>
               (unsigned_long **cur,value_type_conflict7 commonValue,type *prevVal,char **codesOut,
               char **vintsOut)

{
  unsigned_long *puVar1;
  Code CVar2;
  type_conflict tVar3;
  long x;
  char *pcVar4;
  Code code;
  SInt val;
  int i;
  uint8_t codeByte;
  anon_class_8_1_9e4fdca6 getCode;
  char **vintsOut_local;
  char **codesOut_local;
  type *prevVal_local;
  value_type_conflict7 commonValue_local;
  unsigned_long **cur_local;
  
  val._7_1_ = 0;
  _i = commonValue;
  getCode.commonValue = (value_type_conflict7)vintsOut;
  for (val._0_4_ = 0; (int)val != 3; val._0_4_ = (int)val + 1) {
    tVar3 = anon_unknown_0::_Signed<unsigned_long>(**cur);
    x = tVar3 - *prevVal;
    puVar1 = *cur;
    *cur = puVar1 + 1;
    tVar3 = anon_unknown_0::_Signed<unsigned_long>(*puVar1);
    *prevVal = tVar3;
    CVar2 = anon_unknown_0::_EncodeNHelper<3,_const_unsigned_long_*>::anon_class_8_1_9e4fdca6::
            operator()((anon_class_8_1_9e4fdca6 *)&i,x);
    val._7_1_ = val._7_1_ | (byte)(CVar2 << ((char)val * '\x02' & 0x1fU));
    switch(CVar2) {
    default:
      break;
    case Small:
      pcVar4 = anon_unknown_0::_WriteBits<short>(*(char **)getCode.commonValue,(short)x);
      *(char **)getCode.commonValue = pcVar4;
      break;
    case Medium:
      pcVar4 = anon_unknown_0::_WriteBits<int>(*(char **)getCode.commonValue,(int)x);
      *(char **)getCode.commonValue = pcVar4;
      break;
    case Large:
      pcVar4 = *(char **)getCode.commonValue;
      tVar3 = anon_unknown_0::_Signed<long>(x);
      pcVar4 = anon_unknown_0::_WriteBits<long>(pcVar4,tVar3);
      *(char **)getCode.commonValue = pcVar4;
    }
  }
  pcVar4 = anon_unknown_0::_WriteBits<unsigned_char>(*codesOut,val._7_1_);
  *codesOut = pcVar4;
  return;
}

Assistant:

void _EncodeNHelper(
    Iterator &cur,
    typename std::iterator_traits<Iterator>::value_type commonValue,
    typename std::make_signed<
        typename std::iterator_traits<Iterator>::value_type
    >::type &prevVal,
    char *&codesOut,
    char *&vintsOut) {

    using Int = typename std::iterator_traits<Iterator>::value_type;
    using SInt = typename std::make_signed<Int>::type;
    using SmallInt = typename _SmallTypes<Int>::SmallInt;
    using MediumInt = typename _SmallTypes<Int>::MediumInt;

    static_assert(1 <= N && N <= 4, "");

    enum Code { Common, Small, Medium, Large };
    
    auto getCode = [commonValue](SInt x) {
        std::numeric_limits<SmallInt> smallLimit;
        std::numeric_limits<MediumInt> mediumLimit;
        if (x == _Signed(commonValue)) { return Common; }
        if (x >= smallLimit.min() && x <= smallLimit.max()) { return Small; }
        if (x >= mediumLimit.min() && x <= mediumLimit.max()) { return Medium; }
        return Large;
    };

    uint8_t codeByte = 0;
    for (int i = 0; i != N; ++i) {
        SInt val = _Signed(*cur) - prevVal;
        prevVal = _Signed(*cur++);
        Code code = getCode(val);
        codeByte |= (code << (2 * i));
        switch (code) {
        default:
        case Common:
            break;
        case Small:
            vintsOut = _WriteBits(vintsOut, static_cast<SmallInt>(val));
            break;
        case Medium:
            vintsOut = _WriteBits(vintsOut, static_cast<MediumInt>(val));
            break;
        case Large:
            vintsOut = _WriteBits(vintsOut, _Signed(val));
            break;
        };
    }
    codesOut = _WriteBits(codesOut, codeByte);
}